

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_user_cmd.cxx
# Opt level: O0

void __thiscall
nuraft::raft_server::auto_fwd_resp_handler
          (raft_server *this,ptr<cmd_result<ptr<buffer>_>_> *presult,ptr<auto_fwd_pkg> *cur_pkg,
          ptr<rpc_client> *rpc_cli,ptr<resp_msg> *resp,ptr<rpc_exception> *err)

{
  bool bVar1;
  element_type *this_00;
  element_type *this_01;
  socklen_t *in_RCX;
  sockaddr *__addr;
  int __fd;
  cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *in_RSI;
  shared_ptr<std::exception> *psVar2;
  __shared_ptr *in_R9;
  ptr<std::exception> perr;
  ptr<buffer> resp_ctx;
  resp_msg *in_stack_ffffffffffffff28;
  shared_ptr<nuraft::buffer> *in_stack_ffffffffffffff30;
  shared_ptr<nuraft::raft_server::auto_fwd_pkg> *this_02;
  undefined8 in_stack_ffffffffffffff38;
  cmd_result_code code;
  shared_ptr<std::exception> *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  shared_ptr<nuraft::raft_server::auto_fwd_pkg> local_80;
  shared_ptr<std::exception> local_70 [4];
  __shared_ptr *local_30;
  
  code = (cmd_result_code)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  local_30 = in_R9;
  std::shared_ptr<nuraft::buffer>::shared_ptr(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  std::shared_ptr<std::exception>::shared_ptr((shared_ptr<std::exception> *)0x22efe1);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_30);
  if (bVar1) {
    std::shared_ptr<std::exception>::operator=
              ((shared_ptr<std::exception> *)in_stack_ffffffffffffff30,
               (shared_ptr<nuraft::rpc_exception> *)in_stack_ffffffffffffff28);
  }
  else {
    this_00 = std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x22f01b);
    in_stack_ffffffffffffff4f = resp_msg::get_accepted(this_00);
    if ((bool)in_stack_ffffffffffffff4f) {
      std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x22f040);
      resp_msg::get_ctx(in_stack_ffffffffffffff28);
      psVar2 = local_70;
      in_stack_ffffffffffffff40 = psVar2;
      std::shared_ptr<nuraft::buffer>::operator=
                (in_stack_ffffffffffffff30,(shared_ptr<nuraft::buffer> *)in_stack_ffffffffffffff28);
      __fd = (int)psVar2;
      std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x22f070);
      this_01 = std::
                __shared_ptr_access<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x22f07a);
      cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::accept
                (this_01,__fd,__addr,in_RCX);
    }
  }
  std::
  __shared_ptr_access<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x22f0a8);
  cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::set_result
            (in_RSI,(shared_ptr<nuraft::buffer> *)
                    CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
             in_stack_ffffffffffffff40,code);
  this_02 = &local_80;
  std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>::shared_ptr
            (this_02,(shared_ptr<nuraft::raft_server::auto_fwd_pkg> *)in_stack_ffffffffffffff28);
  std::shared_ptr<nuraft::rpc_client>::shared_ptr
            ((shared_ptr<nuraft::rpc_client> *)this_02,
             (shared_ptr<nuraft::rpc_client> *)in_stack_ffffffffffffff28);
  auto_fwd_release_rpc_cli
            ((raft_server *)cur_pkg,(ptr<auto_fwd_pkg> *)rpc_cli,(ptr<rpc_client> *)resp);
  std::shared_ptr<nuraft::rpc_client>::~shared_ptr((shared_ptr<nuraft::rpc_client> *)0x22f10c);
  std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>::~shared_ptr
            ((shared_ptr<nuraft::raft_server::auto_fwd_pkg> *)0x22f116);
  std::shared_ptr<std::exception>::~shared_ptr((shared_ptr<std::exception> *)0x22f123);
  std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x22f130);
  return;
}

Assistant:

void raft_server::auto_fwd_resp_handler( ptr<cmd_result<ptr<buffer>>> presult,
                                         ptr<auto_fwd_pkg> cur_pkg,
                                         ptr<rpc_client> rpc_cli,
                                         ptr<resp_msg>& resp,
                                         ptr<rpc_exception>& err )
{
    ptr<buffer> resp_ctx(nullptr);
    ptr<std::exception> perr;
    if (err) {
        perr = err;
    } else {
        if (resp->get_accepted()) {
            resp_ctx = resp->get_ctx();
            presult->accept();
        }
    }

    presult->set_result(resp_ctx, perr);
    auto_fwd_release_rpc_cli(cur_pkg, rpc_cli);
}